

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O1

bool qt_isect_curve_horizontal(QBezier *bezier,qreal y,qreal x1,qreal x2,int depth)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  long in_FS_OFFSET;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  double dVar8;
  undefined1 local_c8 [32];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0xffffffff;
  uStack_34 = 0xffffffff;
  uStack_30 = 0xffffffff;
  uStack_2c = 0xffffffff;
  local_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  QBezier::bounds(bezier);
  if (((((double)CONCAT44(uStack_3c,uStack_40) <= y) &&
       (y < (double)CONCAT44(uStack_3c,uStack_40) + (double)CONCAT44(uStack_2c,uStack_30))) &&
      ((double)CONCAT44(uStack_44,local_48) < x2)) &&
     (x1 <= (double)CONCAT44(uStack_44,local_48) + (double)CONCAT44(uStack_34,local_38))) {
    bVar4 = true;
    if ((depth == 0x20) ||
       (((double)CONCAT44(uStack_2c,uStack_30) < 0.01 &&
        ((double)CONCAT44(uStack_34,local_38) < 0.01)))) goto LAB_003ece3c;
    local_c8._0_8_ = bezier->x1;
    local_c8._8_8_ = bezier->y1;
    dVar1 = ((double)local_c8._0_8_ + bezier->x2) * 0.5;
    dVar2 = ((double)local_c8._8_8_ + bezier->y2) * 0.5;
    local_c8._24_4_ = SUB84(dVar2,0);
    local_c8._16_8_ = dVar1;
    local_c8._28_4_ = (int)((ulong)dVar2 >> 0x20);
    dVar7 = (bezier->x2 + bezier->x3) * 0.5;
    dVar8 = (bezier->y2 + bezier->y3) * 0.5;
    dVar1 = (dVar1 + dVar7) * 0.5;
    dVar2 = (dVar2 + dVar8) * 0.5;
    local_a8._8_4_ = SUB84(dVar2,0);
    local_a8._0_8_ = dVar1;
    local_a8._12_4_ = (int)((ulong)dVar2 >> 0x20);
    local_58 = bezier->x4;
    dStack_50 = bezier->y4;
    local_68 = (bezier->x3 + local_58) * 0.5;
    dStack_60 = (bezier->y3 + dStack_50) * 0.5;
    local_78 = (dVar7 + local_68) * 0.5;
    dStack_70 = (dVar8 + dStack_60) * 0.5;
    dVar1 = (dVar1 + local_78) * 0.5;
    dVar2 = (dVar2 + dStack_70) * 0.5;
    uVar5 = SUB84(dVar2,0);
    uVar6 = (undefined4)((ulong)dVar2 >> 0x20);
    local_98._8_4_ = uVar5;
    local_98._0_8_ = dVar1;
    local_98._12_4_ = uVar6;
    local_88._8_4_ = uVar5;
    local_88._0_8_ = dVar1;
    local_88._12_4_ = uVar6;
    bVar3 = qt_isect_curve_horizontal((QBezier *)local_c8,y,x1,x2,depth + 1);
    if (bVar3) goto LAB_003ece3c;
    bVar3 = qt_isect_curve_horizontal((QBezier *)local_88,y,x1,x2,depth + 1);
    if (bVar3) goto LAB_003ece3c;
  }
  bVar4 = false;
LAB_003ece3c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

static bool qt_isect_curve_horizontal(const QBezier &bezier, qreal y, qreal x1, qreal x2, int depth = 0)
{
    QRectF bounds = bezier.bounds();

    if (y >= bounds.top() && y < bounds.bottom()
        && bounds.right() >= x1 && bounds.left() < x2) {
        const qreal lower_bound = qreal(.01);
        if (depth == 32 || (bounds.width() < lower_bound && bounds.height() < lower_bound))
            return true;

        const auto halves = bezier.split();
        if (qt_isect_curve_horizontal(halves.first, y, x1, x2, depth + 1)
            || qt_isect_curve_horizontal(halves.second, y, x1, x2, depth + 1))
            return true;
    }
    return false;
}